

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

int JsFgets(char *buf,int size,PAL_FILE *file)

{
  bool bVar1;
  bool bVar2;
  int local_38;
  int local_34;
  int i;
  int c;
  bool crflag;
  int n;
  PAL_FILE *file_local;
  int size_local;
  char *buf_local;
  
  if (size + -1 < 0) {
    buf_local._4_4_ = -1;
  }
  else {
    bVar2 = false;
    local_38 = 0;
    while( true ) {
      bVar1 = false;
      if (local_38 < size + -1) {
        local_34 = PAL_getc(file);
        bVar1 = local_34 != -1;
      }
      if (!bVar1) goto LAB_00119f47;
      buf[local_38] = (char)local_34;
      if (local_34 == 10) {
        local_38 = local_38 + 1;
        goto LAB_00119f47;
      }
      if (bVar2) break;
      bVar2 = local_34 == 0xd;
      local_38 = local_38 + 1;
    }
    PAL_ungetc(local_34,file);
LAB_00119f47:
    buf[local_38] = '\0';
    buf_local._4_4_ = local_38;
  }
  return buf_local._4_4_;
}

Assistant:

int JsFgets(char* buf, int size, FILE* file)
{
    int n = size - 1;
    if (n < 0)
        return -1;

    bool crflag = false;
    int c, i = 0;

    for (i = 0; i < n && (c = getc(file)) != EOF; i++) {
        buf[i] = (char)c;
        if (c == '\n') {        // any \n ends a line
            i++;                // keep the \n; we know there is room for \0
            break;
        }
        if (crflag) {           // \r not followed by \n ends line at the \r
            ungetc(c, file);
            break;              // and overwrite c in buf with \0
        }
        crflag = (c == '\r');
    }

    buf[i] = '\0';
    return i;
}